

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralizedSelfAdjointEigenSolver.h
# Opt level: O0

GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::compute
          (GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,
          MatrixType *matA,MatrixType *matB,int options)

{
  Index IVar1;
  Index IVar2;
  bool bVar3;
  bool local_18a;
  MatrixTypeNested local_160;
  Product<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_158;
  MatrixTypeNested local_148;
  Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_2U>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_140;
  MatrixTypeNested local_130;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>,_0>
  local_128;
  MatrixTypeNested local_118;
  undefined1 local_110 [8];
  MatrixType matC_2;
  MatrixTypeNested local_f0;
  Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_2U>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_e8;
  MatrixTypeNested local_d8;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>,_0>
  local_d0;
  MatrixTypeNested local_c0;
  undefined1 local_b8 [8];
  MatrixType matC_1;
  MatrixTypeNested local_98;
  MatrixTypeNested local_90 [3];
  MatrixTypeNested local_78;
  undefined1 local_70 [8];
  MatrixType matC;
  undefined1 local_50 [4];
  int type;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> cholB;
  bool computeEigVecs;
  int options_local;
  MatrixType *matB_local;
  MatrixType *matA_local;
  GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_local;
  
  cholB.m_info = options;
  IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    (&matA->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&matA->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  bVar3 = false;
  if (IVar1 == IVar2) {
    IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      (&matB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      (&matA->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    bVar3 = false;
    if (IVar1 == IVar2) {
      IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                        (&matB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
      IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                        (&matB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
      bVar3 = IVar1 == IVar2;
    }
  }
  if (!bVar3) {
    __assert_fail("matA.cols()==matA.rows() && matB.rows()==matA.rows() && matB.cols()==matB.rows()"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Eigenvalues/GeneralizedSelfAdjointEigenSolver.h"
                  ,0xa5,
                  "GeneralizedSelfAdjointEigenSolver<MatrixType> &Eigen::GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double, -1, -1>>::compute(const MatrixType &, const MatrixType &, int) [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  bVar3 = false;
  if ((((cholB.m_info & 0xfffff83f) == Success) && (bVar3 = false, (cholB.m_info & 0xc0) != 0xc0))
     && (((cholB.m_info & 0x700) == Success ||
         ((((cholB.m_info & 0x700) == 0x100 || ((cholB.m_info & 0x700) == 0x200)) ||
          (bVar3 = false, (cholB.m_info & 0x700) == 0x400)))))) {
    bVar3 = true;
  }
  if (!bVar3) {
    __assert_fail("(options&~(EigVecMask|GenEigMask))==0 && (options&EigVecMask)!=EigVecMask && ((options&GenEigMask)==0 || (options&GenEigMask)==Ax_lBx || (options&GenEigMask)==ABx_lx || (options&GenEigMask)==BAx_lx) && \"invalid option parameter\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Eigenvalues/GeneralizedSelfAdjointEigenSolver.h"
                  ,0xaa,
                  "GeneralizedSelfAdjointEigenSolver<MatrixType> &Eigen::GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double, -1, -1>>::compute(const MatrixType &, const MatrixType &, int) [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  local_18a = (cholB.m_info & 0xc0) == Success || (cholB.m_info & 0xc0) == 0x80;
  cholB._35_1_ = local_18a;
  LLT<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)local_50,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)matB);
  matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ =
       cholB.m_info & 0x700;
  if (matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_
      == Success) {
    matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ =
         0x100;
  }
  if (matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_
      == 0x100) {
    local_78 = (MatrixTypeNested)
               MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::selfadjointView<1u>
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)matA);
    Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::SelfAdjointView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
              ((Matrix<double,_1,_1,0,_1,_1> *)local_70,
               (EigenBase<Eigen::SelfAdjointView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                *)&local_78);
    local_90[0] = (MatrixTypeNested)
                  LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixL
                            ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_50);
    TriangularViewImpl<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1u,Eigen::Dense>::
    solveInPlace<1,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((TriangularViewImpl<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u,Eigen::Dense> *)
               local_90,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_70);
    local_98.m_matrix =
         (non_const_type)
         LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixU
                   ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_50);
    TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,2u,Eigen::Dense>
    ::solveInPlace<2,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,2u,Eigen::Dense>
                *)&local_98,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_70);
    SelfAdjointEigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_70,
               ((byte)cholB._35_1_ & 1) * 0x40 + 0x40);
    if ((cholB._35_1_ & 1) != 0) {
      matC_1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           (Index)LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixU
                            ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_50);
      TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,2u,Eigen::Dense>
      ::solveInPlace<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,2u,Eigen::Dense>
                  *)&matC_1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this)
      ;
    }
    Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_70);
  }
  else if (matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
           _4_4_ == 0x200) {
    local_c0 = (MatrixTypeNested)
               MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::selfadjointView<1u>
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)matA);
    Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::SelfAdjointView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
              ((Matrix<double,_1,_1,0,_1,_1> *)local_b8,
               (EigenBase<Eigen::SelfAdjointView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                *)&local_c0);
    local_d8 = (MatrixTypeNested)
               LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixL
                         ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_50);
    local_d0 = Eigen::operator*((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_b8,
                                (TriangularViewImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U,_Eigen::Dense>
                                 *)&local_d8);
    Matrix<double,-1,-1,0,-1,-1>::operator=
              ((Matrix<double,_1,_1,0,_1,_1> *)local_b8,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>,_0>_>
                *)&local_d0);
    local_f0.m_matrix =
         (non_const_type)
         LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixU
                   ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_50);
    local_e8 = TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,2u,Eigen::Dense>
               ::operator*((TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,2u,Eigen::Dense>
                            *)&local_f0,
                           (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_b8);
    Matrix<double,-1,-1,0,-1,-1>::operator=
              ((Matrix<double,_1,_1,0,_1,_1> *)local_b8,
               (DenseBase<Eigen::Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_2U>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)&local_e8);
    SelfAdjointEigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_b8,
               ((byte)cholB._35_1_ & 1) * 0x40 + 0x40);
    if ((cholB._35_1_ & 1) != 0) {
      matC_2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           (Index)LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixU
                            ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_50);
      TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,2u,Eigen::Dense>
      ::solveInPlace<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,2u,Eigen::Dense>
                  *)&matC_2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this)
      ;
    }
    Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_b8);
  }
  else {
    if (matC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_
        == 0x400) {
      local_118 = (MatrixTypeNested)
                  MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::selfadjointView<1u>
                            ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)matA);
      Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::SelfAdjointView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
                ((Matrix<double,_1,_1,0,_1,_1> *)local_110,
                 (EigenBase<Eigen::SelfAdjointView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                  *)&local_118);
      local_130 = (MatrixTypeNested)
                  LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixL
                            ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_50);
      local_128 = Eigen::operator*((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                   local_110,
                                   (TriangularViewImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U,_Eigen::Dense>
                                    *)&local_130);
      Matrix<double,-1,-1,0,-1,-1>::operator=
                ((Matrix<double,_1,_1,0,_1,_1> *)local_110,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>,_0>_>
                  *)&local_128);
      local_148.m_matrix =
           (non_const_type)
           LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixU
                     ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_50);
      local_140 = TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,2u,Eigen::Dense>
                  ::operator*((TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,2u,Eigen::Dense>
                               *)&local_148,
                              (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_110);
      Matrix<double,-1,-1,0,-1,-1>::operator=
                ((Matrix<double,_1,_1,0,_1,_1> *)local_110,
                 (DenseBase<Eigen::Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_2U>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                  *)&local_140);
      SelfAdjointEigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,
                 (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_110,
                 ((byte)cholB._35_1_ & 1) * 0x40 + 0x40);
      if ((cholB._35_1_ & 1) != 0) {
        local_160 = (MatrixTypeNested)
                    LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixL
                              ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_50);
        local_158 = TriangularViewImpl<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1u,Eigen::Dense>::
                    operator*((TriangularViewImpl<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u,Eigen::Dense>
                               *)&local_160,
                              (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
        Matrix<double,-1,-1,0,-1,-1>::operator=
                  ((Matrix<double,_1,_1,0,_1,_1> *)this,
                   (DenseBase<Eigen::Product<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                    *)&local_158);
      }
      Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_110);
    }
  }
  LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::~LLT
            ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_50);
  return this;
}

Assistant:

GeneralizedSelfAdjointEigenSolver<MatrixType>& GeneralizedSelfAdjointEigenSolver<MatrixType>::
compute(const MatrixType& matA, const MatrixType& matB, int options)
{
  eigen_assert(matA.cols()==matA.rows() && matB.rows()==matA.rows() && matB.cols()==matB.rows());
  eigen_assert((options&~(EigVecMask|GenEigMask))==0
          && (options&EigVecMask)!=EigVecMask
          && ((options&GenEigMask)==0 || (options&GenEigMask)==Ax_lBx
           || (options&GenEigMask)==ABx_lx || (options&GenEigMask)==BAx_lx)
          && "invalid option parameter");

  bool computeEigVecs = ((options&EigVecMask)==0) || ((options&EigVecMask)==ComputeEigenvectors);

  // Compute the cholesky decomposition of matB = L L' = U'U
  LLT<MatrixType> cholB(matB);

  int type = (options&GenEigMask);
  if(type==0)
    type = Ax_lBx;

  if(type==Ax_lBx)
  {
    // compute C = inv(L) A inv(L')
    MatrixType matC = matA.template selfadjointView<Lower>();
    cholB.matrixL().template solveInPlace<OnTheLeft>(matC);
    cholB.matrixU().template solveInPlace<OnTheRight>(matC);

    Base::compute(matC, computeEigVecs ? ComputeEigenvectors : EigenvaluesOnly );

    // transform back the eigen vectors: evecs = inv(U) * evecs
    if(computeEigVecs)
      cholB.matrixU().solveInPlace(Base::m_eivec);
  }
  else if(type==ABx_lx)
  {
    // compute C = L' A L
    MatrixType matC = matA.template selfadjointView<Lower>();
    matC = matC * cholB.matrixL();
    matC = cholB.matrixU() * matC;

    Base::compute(matC, computeEigVecs ? ComputeEigenvectors : EigenvaluesOnly);

    // transform back the eigen vectors: evecs = inv(U) * evecs
    if(computeEigVecs)
      cholB.matrixU().solveInPlace(Base::m_eivec);
  }
  else if(type==BAx_lx)
  {
    // compute C = L' A L
    MatrixType matC = matA.template selfadjointView<Lower>();
    matC = matC * cholB.matrixL();
    matC = cholB.matrixU() * matC;

    Base::compute(matC, computeEigVecs ? ComputeEigenvectors : EigenvaluesOnly);

    // transform back the eigen vectors: evecs = L * evecs
    if(computeEigVecs)
      Base::m_eivec = cholB.matrixL() * Base::m_eivec;
  }

  return *this;
}